

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void do_ppu_mode2(Emulator *e)

{
  byte bVar1;
  u8 uVar2;
  bool bVar3;
  u8 uVar4;
  u8 uVar5;
  u8 uVar6;
  ObjPriority OVar7;
  Bool BVar8;
  undefined1 uVar9;
  Obj *pOVar10;
  Obj *pOVar11;
  Obj *pOVar12;
  int local_30;
  int j;
  u8 rel_y;
  Obj *o;
  int local_18;
  u8 y;
  int iStack_14;
  u8 obj_height;
  int i;
  int line_obj_count;
  Emulator *e_local;
  
  dma_synchronize(e);
  if (((e->state).ppu.lcdc.obj_display != FALSE) && ((e->config).disable_obj == FALSE)) {
    iStack_14 = 0;
    bVar1 = s_obj_size_to_height[(e->state).ppu.lcdc.obj_size];
    uVar2 = (e->state).ppu.line_y;
    for (local_18 = 0; local_18 < 0x28; local_18 = local_18 + 1) {
      pOVar10 = (e->state).oam + local_18;
      if ((byte)(uVar2 - pOVar10->y) < bVar1) {
        local_30 = iStack_14;
        if ((e->state).is_cgb == FALSE) {
          while( true ) {
            bVar3 = false;
            if (0 < local_30) {
              bVar3 = pOVar10->x < (e->state).ppu.line_obj[local_30 + -1].x;
            }
            if (!bVar3) break;
            pOVar11 = (e->state).ppu.line_obj + local_30;
            pOVar12 = (e->state).ppu.line_obj + (local_30 + -1);
            uVar4 = pOVar12->x;
            uVar5 = pOVar12->tile;
            uVar6 = pOVar12->byte3;
            OVar7 = pOVar12->priority;
            pOVar11->y = pOVar12->y;
            pOVar11->x = uVar4;
            pOVar11->tile = uVar5;
            pOVar11->byte3 = uVar6;
            pOVar11->priority = OVar7;
            BVar8 = pOVar12->xflip;
            pOVar11->yflip = pOVar12->yflip;
            pOVar11->xflip = BVar8;
            uVar4 = pOVar12->bank;
            uVar5 = pOVar12->cgb_palette;
            uVar9 = pOVar12->field_0x13;
            pOVar11->palette = pOVar12->palette;
            pOVar11->bank = uVar4;
            pOVar11->cgb_palette = uVar5;
            pOVar11->field_0x13 = uVar9;
            local_30 = local_30 + -1;
          }
        }
        pOVar11 = (e->state).ppu.line_obj + local_30;
        uVar4 = pOVar10->x;
        uVar5 = pOVar10->tile;
        uVar6 = pOVar10->byte3;
        OVar7 = pOVar10->priority;
        pOVar11->y = pOVar10->y;
        pOVar11->x = uVar4;
        pOVar11->tile = uVar5;
        pOVar11->byte3 = uVar6;
        pOVar11->priority = OVar7;
        BVar8 = pOVar10->xflip;
        pOVar11->yflip = pOVar10->yflip;
        pOVar11->xflip = BVar8;
        uVar4 = pOVar10->bank;
        uVar5 = pOVar10->cgb_palette;
        uVar9 = pOVar10->field_0x13;
        pOVar11->palette = pOVar10->palette;
        pOVar11->bank = uVar4;
        pOVar11->cgb_palette = uVar5;
        pOVar11->field_0x13 = uVar9;
        iStack_14 = iStack_14 + 1;
        if (iStack_14 == 10) break;
      }
    }
    (e->state).ppu.line_obj_count = (u8)iStack_14;
  }
  return;
}

Assistant:

static void do_ppu_mode2(Emulator* e) {
  dma_synchronize(e);
  if (!LCDC.obj_display || e->config.disable_obj) {
    return;
  }

  int line_obj_count = 0;
  int i;
  u8 obj_height = s_obj_size_to_height[LCDC.obj_size];
  u8 y = PPU.line_y;
  for (i = 0; i < OBJ_COUNT; ++i) {
    /* Put the visible sprites into line_obj. Insert them so sprites with
     * smaller X-coordinates are earlier, but only on DMG. On CGB, they are
     * always ordered by obj index. */
    Obj* o = &OAM[i];
    u8 rel_y = y - o->y;
    if (rel_y < obj_height) {
      int j = line_obj_count;
      if (!IS_CGB) {
        while (j > 0 && o->x < PPU.line_obj[j - 1].x) {
          PPU.line_obj[j] = PPU.line_obj[j - 1];
          j--;
        }
      }
      PPU.line_obj[j] = *o;
      if (++line_obj_count == OBJ_PER_LINE_COUNT) {
        break;
      }
    }
  }
  PPU.line_obj_count = line_obj_count;
}